

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

box3f * __thiscall
pbrt::Curve::getPrimBounds(box3f *__return_storage_ptr__,Curve *this,size_t param_1,affine3f *xfm)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  pointer pvVar11;
  pointer pvVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pvVar12 = (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pvVar11 = (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pvVar12 == pvVar11) {
    fVar16 = -3.4028235e+38;
    fVar17 = -3.4028235e+38;
    fVar18 = 3.4028235e+38;
    fVar19 = 3.4028235e+38;
    fVar15 = 3.4028235e+38;
    fVar14 = -3.4028235e+38;
  }
  else {
    uVar1 = (xfm->l).vx.x;
    uVar6 = (xfm->l).vx.y;
    uVar2 = (xfm->l).vy.x;
    uVar7 = (xfm->l).vy.y;
    uVar3 = (xfm->l).vz.x;
    uVar8 = (xfm->l).vz.y;
    uVar4 = (xfm->p).x;
    uVar9 = (xfm->p).y;
    fVar16 = -3.4028235e+38;
    fVar17 = -3.4028235e+38;
    fVar18 = 3.4028235e+38;
    fVar19 = 3.4028235e+38;
    fVar13 = -3.4028235e+38;
    fVar20 = 3.4028235e+38;
    do {
      fVar21 = pvVar12->x;
      uVar5 = pvVar12->y;
      uVar10 = pvVar12->z;
      fVar14 = (float)uVar10 * (xfm->l).vz.z + fVar21 * (xfm->l).vx.z + (float)uVar5 * (xfm->l).vy.z
               + (xfm->p).z;
      fVar15 = fVar14;
      if (fVar20 <= fVar14) {
        fVar15 = fVar20;
      }
      fVar20 = (float)uVar10 * (float)uVar3 + (float)uVar5 * (float)uVar2 + fVar21 * (float)uVar1 +
               (float)uVar4;
      fVar21 = (float)uVar10 * (float)uVar8 + (float)uVar5 * (float)uVar7 + fVar21 * (float)uVar6 +
               (float)uVar9;
      fVar16 = (float)(~-(uint)(fVar16 < fVar21) & (uint)fVar16 |
                      (uint)fVar21 & -(uint)(fVar16 < fVar21));
      fVar17 = (float)(~-(uint)(fVar17 < fVar20) & (uint)fVar17 |
                      (uint)fVar20 & -(uint)(fVar17 < fVar20));
      fVar18 = (float)(~-(uint)(fVar21 < fVar18) & (uint)fVar18 |
                      (uint)fVar21 & -(uint)(fVar21 < fVar18));
      fVar19 = (float)(~-(uint)(fVar20 < fVar19) & (uint)fVar19 |
                      (uint)fVar20 & -(uint)(fVar20 < fVar19));
      if (fVar14 <= fVar13) {
        fVar14 = fVar13;
      }
      pvVar12 = pvVar12 + 1;
      fVar13 = fVar14;
      fVar20 = fVar15;
    } while (pvVar12 != pvVar11);
  }
  fVar13 = this->width1;
  if (this->width1 <= this->width0) {
    fVar13 = this->width0;
  }
  (__return_storage_ptr__->lower).x = fVar19 - fVar13;
  (__return_storage_ptr__->lower).y = fVar18 - fVar13;
  (__return_storage_ptr__->lower).z = fVar15 - fVar13;
  (__return_storage_ptr__->upper).x = fVar13 + fVar17;
  (__return_storage_ptr__->upper).y = fVar13 + fVar16;
  (__return_storage_ptr__->upper).z = fVar13 + fVar14;
  return __return_storage_ptr__;
}

Assistant:

box3f Curve::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    for (auto p : P)
      primBounds.extend(xfmPoint(xfm,p));
    vec3f maxWidth = vec3f(std::max(width0,width1));
    primBounds.lower = primBounds.lower - maxWidth;
    primBounds.upper = primBounds.upper + maxWidth;
    return primBounds;
  }